

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinSerializer<std::__cxx11::list<int,_std::allocator<int>_>,_void>::
     serialize_elems<OutputStream>(long *param_1,undefined8 param_2,long *param_3)

{
  undefined8 in_RAX;
  long *plVar1;
  undefined8 uStack_28;
  
  plVar1 = (long *)*param_1;
  if (plVar1 != param_1) {
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44((int)plVar1[2],(undefined4)uStack_28);
      std::ostream::write((char *)(*param_3 + 0x10),(long)&uStack_28 + 4);
      plVar1 = (long *)*plVar1;
    } while (plVar1 != param_1);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::false_type /* no batch copy */,
    const Sequence& s, std::uint32_t /* size */, OutputStream& ostream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::serialize<value_type>(elem, ostream);
    }
  }